

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O2

int __thiscall dic::dictRelese(dic *this,int dictidx)

{
  dictEntry *pdVar1;
  pointer pdVar2;
  dictEntry *pdVar3;
  uint uVar4;
  
  uVar4 = 0;
  while( true ) {
    pdVar2 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar2[dictidx].ht[0].size <= (ulong)uVar4) break;
    pdVar3 = pdVar2[dictidx].ht[0].table[uVar4];
    while (pdVar3 != (dictEntry *)0x0) {
      pdVar1 = pdVar3->next;
      operator_delete(pdVar3);
      pdVar3 = pdVar1;
    }
    uVar4 = uVar4 + 1;
  }
  if (pdVar2[dictidx].rehashidx != -1) {
    for (uVar4 = 0; (ulong)uVar4 < *(unsigned_long *)((long)(pdVar2[dictidx].ht + 1) + 8);
        uVar4 = uVar4 + 1) {
      pdVar3 = pdVar2[dictidx].ht[1].table[uVar4];
      while (pdVar3 != (dictEntry *)0x0) {
        pdVar1 = pdVar3->next;
        operator_delete(pdVar3);
        pdVar3 = pdVar1;
      }
      pdVar2 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  std::vector<dict,_std::allocator<dict>_>::erase(&this->dc,pdVar2 + dictidx);
  return 1;
}

Assistant:

int dic::dictRelese(int dictidx){
    dictEntry *fetch=NULL;
    dictEntry *tmp=NULL;
    //relese ht
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  
    if(dc[dictidx].rehashidx!=-1){
        for(unsigned int i=0;i<dc[dictidx].ht[1].size;i++){
            fetch=dc[dictidx].ht[1].table[i];
            while(fetch!=NULL){
                tmp=fetch;
                fetch=fetch->next;
                delete tmp;
                tmp=NULL;
            }
        }  
    } 
    //delete database
    dc.erase(dc.begin()+dictidx);

    return 1;
}